

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O0

void ptls_buffer_init(ptls_buffer_t *buf,void *smallbuf,size_t smallbuf_size)

{
  size_t smallbuf_size_local;
  void *smallbuf_local;
  ptls_buffer_t *buf_local;
  
  if (smallbuf != (void *)0x0) {
    buf->base = (uint8_t *)smallbuf;
    buf->off = 0;
    buf->capacity = smallbuf_size;
    buf->is_allocated = '\0';
    buf->align_bits = '\0';
    return;
  }
  __assert_fail("smallbuf != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/include/picotls.h",
                0x7d4,"void ptls_buffer_init(ptls_buffer_t *, void *, size_t)");
}

Assistant:

inline void ptls_buffer_init(ptls_buffer_t *buf, void *smallbuf, size_t smallbuf_size)
{
    assert(smallbuf != NULL);
    buf->base = (uint8_t *)smallbuf;
    buf->off = 0;
    buf->capacity = smallbuf_size;
    buf->is_allocated = 0;
    buf->align_bits = 0;
}